

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * path<std::__cxx11::string,char_const*>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pathList,
                   char *pathList_1)

{
  anon_class_8_1_89901123 append;
  allocator local_39;
  anon_class_8_1_89901123 local_38;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38.path = __return_storage_ptr__;
  path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::anon_class_8_1_89901123::operator()(&local_38,pathList);
  std::__cxx11::string::string((string *)&local_30,pathList_1,&local_39);
  path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::anon_class_8_1_89901123::operator()(&local_38,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string path(T... pathList) {
    std::string path;
    auto append = [&path](const std::string &s) {
        if ((path.empty() || path.back() == '\\') || (!s.empty() && s.front() == '\\')) {
            path.append(s);
        } else {
            path.append(pathSeparator()).append(s);
        }
    };
    std::initializer_list<int>{(append(pathList), 0)...};
    return path;
}